

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Generator.h
# Opt level: O3

void cppqc::detail::TupleGeneratorHelper_shrink<0,int>::
     appendShrinks<std::tuple<cppqc::Generator<int>>>
               (tuple<int> *shrinkInput,
               vector<std::tuple<int>,_std::allocator<std::tuple<int>_>_> *shrinkOutput,
               tuple<cppqc::Generator<int>_> *generators)

{
  __uniq_ptr_impl<cppqc::detail::GenConcept<int>,_std::default_delete<cppqc::detail::GenConcept<int>_>_>
  _Var1;
  iterator __position;
  int *localShrink;
  _Head_base<0UL,_int,_false> *p_Var2;
  vector<int,_std::allocator<int>_> allLocalShrinks;
  _Head_base<0UL,_int,_false> local_3c;
  _Head_base<0UL,_int,_false> *local_38;
  _Head_base<0UL,_int,_false> *local_30;
  
  _Var1._M_t.
  super__Tuple_impl<0UL,_cppqc::detail::GenConcept<int>_*,_std::default_delete<cppqc::detail::GenConcept<int>_>_>
  .super__Head_base<0UL,_cppqc::detail::GenConcept<int>_*,_false>._M_head_impl =
       (generators->super__Tuple_impl<0UL,_cppqc::Generator<int>_>).
       super__Head_base<0UL,_cppqc::Generator<int>,_false>._M_head_impl.m_gen._M_t.
       super___uniq_ptr_impl<cppqc::detail::GenConcept<int>,_std::default_delete<cppqc::detail::GenConcept<int>_>_>
       ._M_t;
  (**(code **)(*(long *)_Var1._M_t.
                        super__Tuple_impl<0UL,_cppqc::detail::GenConcept<int>_*,_std::default_delete<cppqc::detail::GenConcept<int>_>_>
                        .super__Head_base<0UL,_cppqc::detail::GenConcept<int>_*,_false>._M_head_impl
              + 0x18))
            (&local_38,
             _Var1._M_t.
             super__Tuple_impl<0UL,_cppqc::detail::GenConcept<int>_*,_std::default_delete<cppqc::detail::GenConcept<int>_>_>
             .super__Head_base<0UL,_cppqc::detail::GenConcept<int>_*,_false>._M_head_impl,
             shrinkInput);
  if (local_38 != local_30) {
    p_Var2 = local_38;
    do {
      local_3c._M_head_impl = p_Var2->_M_head_impl;
      __position._M_current =
           (shrinkOutput->super__Vector_base<std::tuple<int>,_std::allocator<std::tuple<int>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (shrinkOutput->super__Vector_base<std::tuple<int>,_std::allocator<std::tuple<int>_>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<std::tuple<int>,std::allocator<std::tuple<int>>>::
        _M_realloc_insert<std::tuple<int>>
                  ((vector<std::tuple<int>,std::allocator<std::tuple<int>>> *)shrinkOutput,
                   __position,(tuple<int> *)&local_3c);
      }
      else {
        ((__position._M_current)->super__Tuple_impl<0UL,_int>).super__Head_base<0UL,_int,_false>.
        _M_head_impl = local_3c._M_head_impl;
        (shrinkOutput->super__Vector_base<std::tuple<int>,_std::allocator<std::tuple<int>_>_>).
        _M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      p_Var2 = p_Var2 + 1;
    } while (p_Var2 != local_30);
  }
  if (local_38 != (_Head_base<0UL,_int,_false> *)0x0) {
    operator_delete(local_38);
  }
  return;
}

Assistant:

static void appendShrinks(const std::tuple<T...>& shrinkInput,
                            std::vector<std::tuple<T...>>& shrinkOutput,
                            const Generators& generators) {
    // Compute all shrink combinations for the tuple
    // element at the position "offset".
    // All other elements will not be changed.
    static_assert(offset >= 0 && offset < sizeof...(T), "offset out of bounds");
    auto allLocalShrinks =
        std::get<offset>(generators).shrink(std::get<offset>(shrinkInput));
    for (auto&& localShrink : allLocalShrinks) {
      auto copiedShrinkInput = shrinkInput;
      std::get<offset>(copiedShrinkInput) = std::move(localShrink);
      shrinkOutput.push_back(std::move(copiedShrinkInput));
    }

    // continue recursion (from right to left)
    TupleGeneratorHelper_shrink<offset - 1, T...>::appendShrinks(
        shrinkInput, shrinkOutput, generators);
  }